

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodePtr xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  uint uVar1;
  int iVar2;
  xmlNsPtr *ppxVar3;
  xmlXPathContextPtr pxVar4;
  xmlNode *node;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar4 = ctxt->context;
  if ((pxVar4 != (xmlXPathContextPtr)0x0) && (node = pxVar4->node, node->type == XML_ELEMENT_NODE))
  {
    if (cur == (xmlNodePtr)0x0) {
      if (pxVar4->tmpNsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(pxVar4->tmpNsList);
        pxVar4 = ctxt->context;
        node = pxVar4->node;
      }
      pxVar4->tmpNsNr = 0;
      iVar2 = xmlGetNsListSafe(pxVar4->doc,node,&pxVar4->tmpNsList);
      if (-1 < iVar2) {
        pxVar4 = ctxt->context;
        if (pxVar4->tmpNsList == (xmlNsPtr *)0x0) {
          return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
        }
        iVar2 = pxVar4->tmpNsNr;
        for (ppxVar3 = pxVar4->tmpNsList + iVar2; iVar2 = iVar2 + 1, *ppxVar3 != (xmlNsPtr)0x0;
            ppxVar3 = ppxVar3 + 1) {
          pxVar4->tmpNsNr = iVar2;
        }
        return (xmlNodePtr)&xmlXPathXMLNamespaceStruct;
      }
      xmlXPathPErrMemory(ctxt);
    }
    else {
      ppxVar3 = pxVar4->tmpNsList;
      if (0 < pxVar4->tmpNsNr) {
        uVar1 = pxVar4->tmpNsNr - 1;
        pxVar4->tmpNsNr = uVar1;
        return (xmlNodePtr)ppxVar3[uVar1];
      }
      if (ppxVar3 != (xmlNsPtr *)0x0) {
        (*xmlFree)(ppxVar3);
        pxVar4 = ctxt->context;
      }
      pxVar4->tmpNsList = (xmlNsPtr *)0x0;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE) return(NULL);
    if (cur == NULL) {
        if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsNr = 0;
        if (xmlGetNsListSafe(ctxt->context->doc, ctxt->context->node,
                             &ctxt->context->tmpNsList) < 0) {
            xmlXPathPErrMemory(ctxt);
            return(NULL);
        }
        if (ctxt->context->tmpNsList != NULL) {
            while (ctxt->context->tmpNsList[ctxt->context->tmpNsNr] != NULL) {
                ctxt->context->tmpNsNr++;
            }
        }
	return((xmlNodePtr) xmlXPathXMLNamespace);
    }
    if (ctxt->context->tmpNsNr > 0) {
	return (xmlNodePtr)ctxt->context->tmpNsList[--ctxt->context->tmpNsNr];
    } else {
	if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsList = NULL;
	return(NULL);
    }
}